

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,int value,string *url)

{
  ostream *poVar1;
  TAG *pTVar2;
  ostream *stream;
  stringstream href;
  A a;
  TD td;
  CENTER center;
  TR tr;
  int local_8ac;
  string local_8a8;
  stringstream local_888 [16];
  ostream local_878 [376];
  TAG local_700;
  TAG local_548;
  TAG local_390;
  TAG local_1d8;
  
  stream = (ostream *)(s + 0x10);
  local_8ac = value;
  HTML::TR::TR((TR *)&local_1d8,stream);
  HTML::TAG::text(&local_1d8);
  HTML::TD::TD((TD *)&local_548,stream);
  HTML::TAG::text<std::__cxx11::string>(&local_548,name);
  HTML::TAG::~TAG(&local_548);
  HTML::TD::TD((TD *)&local_548,stream);
  HTML::TAG::text<int>(&local_548,&local_8ac);
  HTML::TAG::~TAG(&local_548);
  HTML::TD::TD((TD *)&local_548,stream);
  HTML::TAG::text(&local_548);
  HTML::CENTER::CENTER((CENTER *)&local_390,stream);
  HTML::TAG::text(&local_390);
  std::__cxx11::stringstream::stringstream(local_888);
  poVar1 = std::operator<<(local_878,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,local_8ac + -10);
  HTML::A::A((A *)&local_700,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_700,&local_8a8)->super_TAG;
  HTML::TAG::text<char[3]>(pTVar2,(char (*) [3])"<<");
  std::__cxx11::string::~string((string *)&local_8a8);
  HTML::TAG::~TAG(&local_700);
  std::__cxx11::stringstream::~stringstream(local_888);
  std::operator<<(stream,HTML::NBSP);
  std::__cxx11::stringstream::stringstream(local_888);
  poVar1 = std::operator<<(local_878,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,local_8ac + -1);
  HTML::A::A((A *)&local_700,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_700,&local_8a8)->super_TAG;
  HTML::TAG::text<char[2]>(pTVar2,(char (*) [2])0x1c990a);
  std::__cxx11::string::~string((string *)&local_8a8);
  HTML::TAG::~TAG(&local_700);
  std::__cxx11::stringstream::~stringstream(local_888);
  poVar1 = std::operator<<(stream,HTML::NBSP);
  poVar1 = std::operator<<(poVar1,"|");
  std::operator<<(poVar1,HTML::NBSP);
  std::__cxx11::stringstream::stringstream(local_888);
  poVar1 = std::operator<<(local_878,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,local_8ac + 1);
  HTML::A::A((A *)&local_700,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_700,&local_8a8)->super_TAG;
  HTML::TAG::text<char[2]>(pTVar2,(char (*) [2])0x1c9f92);
  std::__cxx11::string::~string((string *)&local_8a8);
  HTML::TAG::~TAG(&local_700);
  std::__cxx11::stringstream::~stringstream(local_888);
  std::operator<<(stream,HTML::NBSP);
  std::__cxx11::stringstream::stringstream(local_888);
  poVar1 = std::operator<<(local_878,(string *)url);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,local_8ac + 10);
  HTML::A::A((A *)&local_700,stream);
  std::__cxx11::stringbuf::str();
  pTVar2 = &HTML::A::href((A *)&local_700,&local_8a8)->super_TAG;
  HTML::TAG::text<char[3]>(pTVar2,(char (*) [3])">>");
  std::__cxx11::string::~string((string *)&local_8a8);
  HTML::TAG::~TAG(&local_700);
  std::__cxx11::stringstream::~stringstream(local_888);
  HTML::TAG::~TAG(&local_390);
  HTML::TAG::~TAG(&local_548);
  HTML::TAG::~TAG(&local_1d8);
  return;
}

Assistant:

void HttpConnection::showRow(std::stringstream &s, const std::string &name, int value, const std::string &url) {
  {
    TR tr(s);
    tr.text();
    {
      TD td(s);
      td.text(name);
    }
    {
      TD td(s);
      td.text(value);
    }
    {
      TD td(s);
      td.text();
      CENTER center(s);
      center.text();
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value - 10;
        A a(s);
        a.href(href.str()).text("<<");
      }
      s << NBSP;
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value - 1;
        A a(s);
        a.href(href.str()).text("<");
      }
      s << NBSP << "|" << NBSP;
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value + 1;
        A a(s);
        a.href(href.str()).text(">");
      }
      s << NBSP;
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value + 10;
        A a(s);
        a.href(href.str()).text(">>");
      }
    }
  }
}